

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O0

float point_segment_distance(Vec3f *x0,Vec3f *x1,Vec3f *x2)

{
  Vec<3U,_float> *w;
  Vec<3U,_float> *in_RDI;
  float fVar1;
  ulong extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vec<3U,_float> VVar8;
  float s12;
  double m2;
  Vec3f dx;
  Vec<3U,_float> *in_stack_ffffffffffffff38;
  Vec<3U,_float> *in_stack_ffffffffffffff40;
  Vec<3U,_float> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  Vec<3U,_float> local_50;
  float local_44;
  double local_40;
  float local_38 [2];
  float local_30;
  Vec<3U,_float> local_28 [2];
  Vec<3U,_float> *local_8;
  
  auVar7 = in_ZMM0._8_56_;
  local_8 = in_RDI;
  VVar8 = Vec<3U,_float>::operator-
                    ((Vec<3U,_float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                     ,in_stack_ffffffffffffff68);
  local_30 = VVar8.v[2];
  auVar2._0_8_ = VVar8.v._0_8_;
  auVar2._8_56_ = auVar7;
  local_38 = (float  [2])vmovlpd_avx(auVar2._0_16_);
  local_28[0].v._0_8_ = local_38;
  local_28[0].v[2] = local_30;
  fVar1 = mag2<3u,float>(in_stack_ffffffffffffff40);
  local_40 = (double)fVar1;
  auVar7 = ZEXT856(extraout_XMM0_Qb);
  VVar8 = Vec<3U,_float>::operator-
                    ((Vec<3U,_float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                     ,in_stack_ffffffffffffff68);
  local_50.v[2] = VVar8.v[2];
  auVar3._0_8_ = VVar8.v._0_8_;
  auVar3._8_56_ = auVar7;
  local_50.v._0_8_ = vmovlpd_avx(auVar3._0_16_);
  fVar1 = dot<3u,float>(&local_50,local_28);
  local_44 = (float)((double)fVar1 / local_40);
  if (0.0 <= local_44) {
    if (1.0 < local_44) {
      local_44 = 1.0;
    }
  }
  else {
    local_44 = 0.0;
  }
  auVar7 = (undefined1  [56])0x0;
  VVar8 = operator*(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  auVar4._0_8_ = VVar8.v._0_8_;
  auVar4._8_56_ = auVar7;
  vmovlpd_avx(auVar4._0_16_);
  auVar7 = (undefined1  [56])0x0;
  VVar8 = operator*(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  auVar5._0_8_ = VVar8.v._0_8_;
  auVar5._8_56_ = auVar7;
  w = (Vec<3U,_float> *)vmovlpd_avx(auVar5._0_16_);
  VVar8 = Vec<3U,_float>::operator+
                    ((Vec<3U,_float> *)CONCAT44(in_stack_ffffffffffffff74,VVar8.v[2]),w);
  auVar6._0_8_ = VVar8.v._0_8_;
  auVar6._8_56_ = auVar7;
  vmovlpd_avx(auVar6._0_16_);
  fVar1 = dist<3u,float>(local_8,in_stack_ffffffffffffff38);
  return fVar1;
}

Assistant:

static float point_segment_distance(const Vec3f &x0, const Vec3f &x1, const Vec3f &x2) {
  Vec3f dx(x2 - x1);
  double m2 = mag2(dx);
  // find parameter value of closest point on segment
  float s12 = (float)(dot(x2 - x0, dx) / m2);
  if (s12 < 0) {
    s12 = 0;
  } else if (s12 > 1) {
    s12 = 1;
  }
  // and find the distance
  return dist(x0, s12 * x1 + (1 - s12) * x2);
}